

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O2

void __thiscall Funcdata::clearCallSpecs(Funcdata *this)

{
  pointer ppFVar1;
  pointer ppFVar2;
  FuncCallSpecs *this_00;
  int4 i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppFVar1 = (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar2 = (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppFVar2 - (long)ppFVar1 >> 3) <= uVar3) break;
    this_00 = ppFVar1[uVar3];
    if (this_00 != (FuncCallSpecs *)0x0) {
      FuncCallSpecs::~FuncCallSpecs(this_00);
    }
    operator_delete(this_00);
    uVar3 = uVar3 + 1;
  }
  if (ppFVar2 != ppFVar1) {
    (this->qlst).super__Vector_base<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar1;
  }
  return;
}

Assistant:

void Funcdata::clearCallSpecs(void)

{
  int4 i;

  for(i=0;i<qlst.size();++i)
    delete qlst[i];		// Delete each func_callspec

  qlst.clear();			// Delete list of pointers
}